

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp_threads.c
# Opt level: O0

void thread_bridge_transfer
               (CManager source_cm,event_item *event,CManager target_cm,EVstone target_stone)

{
  FILE *__stream;
  int iVar1;
  __pid_t _Var2;
  event_item *file;
  pthread_t pVar3;
  undefined4 in_ECX;
  CManager in_RDX;
  undefined8 in_RSI;
  CManager in_RDI;
  CManager unaff_retaddr;
  timespec ts;
  event_item *new_event;
  CManager_conflict in_stack_ffffffffffffffc0;
  undefined4 local_38;
  int in_stack_ffffffffffffffcc;
  undefined4 in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffd4;
  CManager in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  if (in_RDX == in_RDI) {
    internal_path_submit
              ((CManager_conflict)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc,(event_item *)in_stack_ffffffffffffffc0);
  }
  else {
    if (in_RDI < in_RDX) {
      iVar1 = CManager_locked(in_RDI);
      if (iVar1 == 0) {
        __assert_fail("CManager_locked(source_cm)",
                      "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp_threads.c"
                      ,0x2f,"void thread_bridge_transfer(CManager, event_item *, CManager, EVstone)"
                     );
      }
      IntCManager_lock((CManager)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                       (char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    }
    else {
      IntCManager_unlock((CManager)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                         (char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      IntCManager_lock((CManager)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                       (char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
      IntCManager_lock((CManager)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                       (char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4);
    }
    file = clone_event(in_RDX,(event_item *)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),
                       in_stack_ffffffffffffffd8);
    internal_path_submit
              ((CManager_conflict)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               in_stack_ffffffffffffffcc,(event_item *)in_stack_ffffffffffffffc0);
    return_event((event_path_data)unaff_retaddr,(event_item *)in_RDI);
    iVar1 = CMtrace_val[10];
    if (in_RDI->CMTrace_file == (FILE *)0x0) {
      iVar1 = CMtrace_init(unaff_retaddr,(CMTraceType)((ulong)in_RDI >> 0x20));
    }
    if (iVar1 != 0) {
      if (CMtrace_PID != 0) {
        __stream = (FILE *)in_RDI->CMTrace_file;
        _Var2 = getpid();
        in_stack_ffffffffffffffc0 = (CManager_conflict)(long)_Var2;
        pVar3 = pthread_self();
        fprintf(__stream,"P%lxT%lx - ",in_stack_ffffffffffffffc0,pVar3);
      }
      if (CMtrace_timing != 0) {
        clock_gettime(1,(timespec *)&local_38);
        fprintf((FILE *)in_RDI->CMTrace_file,"%lld.%.9ld - ",
                CONCAT44(in_stack_ffffffffffffffcc,local_38),
                CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0));
      }
      fprintf((FILE *)in_RDI->CMTrace_file,
              "Transferring event %p from cm %p to cm %p, new_event %p\n\n",in_RDI,in_RDX,in_RSI,
              file);
    }
    fflush((FILE *)in_RDI->CMTrace_file);
    IntCManager_unlock((CManager)CONCAT44(in_ECX,in_stack_ffffffffffffffe0),(char *)file,
                       in_stack_ffffffffffffffd4);
    CMwake_server_thread(in_stack_ffffffffffffffc0);
  }
  return;
}

Assistant:

extern void 
thread_bridge_transfer(CManager source_cm, event_item *event, 
		       CManager target_cm, EVstone target_stone)
{
    event_item *new_event;
    if (target_cm == source_cm) {
	internal_path_submit(source_cm, target_stone, event);
	return;
    } else if (target_cm > source_cm) {
	/* source_cm should already be locked, lock the destination */
	assert(CManager_locked(source_cm));
	CManager_lock(target_cm);
    } else {
	/* 
	 * we want to lock the CM's in smallest-first order.
	 * source_cm is larger, so unlock that and then re-aquire the locks.
	 * strict ordering avoids deadlock in case they are transferring 
	 * something to us.
	 */
	CManager_unlock(source_cm);
	CManager_lock(target_cm);
	CManager_lock(source_cm);
    }
    /* Both CMs are locked now */
    new_event = clone_event(source_cm, event, target_cm);
    internal_path_submit(target_cm, target_stone, new_event);
    return_event(source_cm->evp, new_event);
    CMtrace_out(source_cm, EVerbose, "Transferring event %p from cm %p to cm %p, new_event %p\n\n",
		source_cm, target_cm, event, new_event);
    CManager_unlock(target_cm);
    CMwake_server_thread(target_cm);
}